

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

int __thiscall
glcts::TessellationShaderInvarianceTests::init
          (TessellationShaderInvarianceTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TessellationShaderInvarianceRule2Test *this_00;
  TessellationShaderInvarianceRule3Test *this_01;
  TessellationShaderInvarianceRule4Test *this_02;
  TessellationShaderInvarianceRule5Test *this_03;
  TessellationShaderInvarianceRule6Test *this_04;
  TessellationShaderInvarianceRule7Test *this_05;
  TessellationShaderInvarianceTests *this_local;
  
  node = (TestNode *)operator_new(0x2e0);
  TessellationShaderInvarianceRule1Test::TessellationShaderInvarianceRule1Test
            ((TessellationShaderInvarianceRule1Test *)node,(this->super_TestCaseGroupBase).m_context
             ,&(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,node);
  this_00 = (TessellationShaderInvarianceRule2Test *)operator_new(0x2f0);
  TessellationShaderInvarianceRule2Test::TessellationShaderInvarianceRule2Test
            (this_00,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TessellationShaderInvarianceRule3Test *)operator_new(0x2f8);
  TessellationShaderInvarianceRule3Test::TessellationShaderInvarianceRule3Test
            (this_01,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TessellationShaderInvarianceRule4Test *)operator_new(0x2f8);
  TessellationShaderInvarianceRule4Test::TessellationShaderInvarianceRule4Test
            (this_02,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TessellationShaderInvarianceRule5Test *)operator_new(0x310);
  TessellationShaderInvarianceRule5Test::TessellationShaderInvarianceRule5Test
            (this_03,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TessellationShaderInvarianceRule6Test *)operator_new(0x310);
  TessellationShaderInvarianceRule6Test::TessellationShaderInvarianceRule6Test
            (this_04,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (TessellationShaderInvarianceRule7Test *)operator_new(0x310);
  TessellationShaderInvarianceRule7Test::TessellationShaderInvarianceRule7Test
            (this_05,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  return extraout_EAX;
}

Assistant:

void TessellationShaderInvarianceTests::init(void)
{
	addChild(new glcts::TessellationShaderInvarianceRule1Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule2Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule3Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule4Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule5Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule6Test(m_context, m_extParams));
	addChild(new glcts::TessellationShaderInvarianceRule7Test(m_context, m_extParams));
}